

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.h
# Opt level: O0

void __thiscall
SGParser::TokenizerImpl<SGParser::Generator::RegExprParseToken>::TokenizerImpl
          (TokenizerImpl<SGParser::Generator::RegExprParseToken> *this,InputStream *pinputStream)

{
  InputStream *pinputStream_local;
  TokenizerImpl<SGParser::Generator::RegExprParseToken> *this_local;
  
  TokenStream<SGParser::Generator::RegExprParseToken>::TokenStream
            (&this->super_TokenStream<SGParser::Generator::RegExprParseToken>);
  TokenizerBase::TokenizerBase(&this->super_TokenizerBase);
  (this->super_TokenStream<SGParser::Generator::RegExprParseToken>)._vptr_TokenStream =
       (_func_int **)&PTR__TokenizerImpl_001edcc0;
  SetInputStream(this,pinputStream);
  return;
}

Assistant:

explicit TokenizerImpl(InputStream* pinputStream) { SetInputStream(pinputStream); }